

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.hpp
# Opt level: O1

void __thiscall
ableton::link::
Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
::setTimeline(Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
              *this,Timeline *newTimeline,microseconds atTime)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  anon_class_40_3_27407e53_for_handler_ local_48;
  
  uVar2 = 0;
  uVar3 = 0x40340000;
  dVar4 = (newTimeline->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
          super__Head_base<0UL,_double,_false>._M_head_impl;
  if (20.0 <= dVar4) {
    uVar2 = SUB84(dVar4,0);
    uVar3 = (undefined4)((ulong)dVar4 >> 0x20);
  }
  dVar4 = 999.0;
  if ((double)CONCAT44(uVar3,uVar2) <= 999.0) {
    dVar4 = (double)CONCAT44(uVar3,uVar2);
  }
  (newTimeline->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl = dVar4;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mClientTimelineGuard);
  if (iVar1 == 0) {
    (this->mClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
    super__Head_base<0UL,_double,_false>._M_head_impl =
         (newTimeline->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    (this->mClientTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
    super__Head_base<0UL,_long,_false>._M_head_impl =
         (newTimeline->beatOrigin).super_tuple<long>.super__Tuple_impl<0UL,_long>.
         super__Head_base<0UL,_long,_false>._M_head_impl;
    (this->mClientTimeline).timeOrigin.__r = (newTimeline->timeOrigin).__r;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mClientTimelineGuard);
    local_48.newTimeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
    super__Head_base<0UL,_double,_false>._M_head_impl =
         (tuple<double>)
         (newTimeline->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    local_48.newTimeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
    super__Head_base<0UL,_long,_false>._M_head_impl =
         (tuple<long>)
         (newTimeline->beatOrigin).super_tuple<long>.super__Tuple_impl<0UL,_long>.
         super__Head_base<0UL,_long,_false>._M_head_impl;
    local_48.newTimeline.timeOrigin.__r = (newTimeline->timeOrigin).__r;
    local_48.this = this;
    local_48.atTime.__r = atTime.__r;
    asio::io_context::
    post<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::setTimeline(ableton::link::Timeline,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_>
              ((io_context *)
               (this->mIo).val.mpService._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>,&local_48);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void setTimeline(Timeline newTimeline, const std::chrono::microseconds atTime)
  {
    newTimeline = clampTempo(newTimeline);
    {
      std::lock_guard<std::mutex> lock(mClientTimelineGuard);
      mClientTimeline = newTimeline;
    }
    mIo->async([this, newTimeline, atTime] {
      handleTimelineFromClient(updateSessionTimelineFromClient(
        mSessionTimeline, newTimeline, atTime, mGhostXForm));
    });
  }